

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O2

void __thiscall
MADPComponentDiscreteObservations::AddObservation
          (MADPComponentDiscreteObservations *this,Index AI,string *name,string *description)

{
  pointer puVar1;
  unsigned_long uVar2;
  ostream *poVar3;
  E *this_00;
  ulong uVar4;
  ulong uVar5;
  vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_> thisAgentsObservations;
  stringstream ss;
  ostream local_1a0 [376];
  
  puVar1 = (this->_m_nrObservations).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (ulong)AI;
  uVar4 = (long)(this->_m_nrObservations).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  if (uVar4 == uVar5) {
    _ss = (_func_int **)0x1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&this->_m_nrObservations,(unsigned_long *)&ss);
    thisAgentsObservations.
    super__Vector_base<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    thisAgentsObservations.
    super__Vector_base<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    thisAgentsObservations.
    super__Vector_base<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ObservationDiscrete::ObservationDiscrete((ObservationDiscrete *)&ss,0,name,description);
    std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>::push_back
              (&thisAgentsObservations,(value_type *)&ss);
    std::
    vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
    ::push_back(&this->_m_observationVecs,&thisAgentsObservations);
    NamedDescribedEntity::~NamedDescribedEntity((NamedDescribedEntity *)&ss);
    std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>::~vector
              (&thisAgentsObservations);
  }
  else {
    if (uVar4 != AI + 1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar3 = std::operator<<(local_1a0,"MADPComponentDiscreteObservations::AddObservation(");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = std::operator<<(poVar3,(string *)name);
      poVar3 = std::operator<<(poVar3,
                               ") - error, observations of agents should be specified in order!");
      poVar3 = std::operator<<(poVar3,
                               " first all observations of agent 1, then all of agent 2,...etc...");
      poVar3 = std::operator<<(poVar3," _m_nrObservations.size now is: ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,
                               "\n(the vector _m_nrObservations should contain entries for all ");
      std::operator<<(poVar3,"preceeding agents.)");
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,&ss);
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
    uVar2 = puVar1[uVar5];
    puVar1[uVar5] = uVar2 + 1;
    ObservationDiscrete::ObservationDiscrete
              ((ObservationDiscrete *)&ss,(Index)uVar2,name,description);
    std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>::push_back
              ((this->_m_observationVecs).
               super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar5,(ObservationDiscrete *)&ss);
    NamedDescribedEntity::~NamedDescribedEntity((NamedDescribedEntity *)&ss);
  }
  return;
}

Assistant:

void MADPComponentDiscreteObservations::AddObservation(Index AI,
                                                       const string &name,
                                                       const string &description)
{
    if(DEBUG_ADD_DO) 
        cerr<<"MADPComponentDiscreteObservation::AddObservation("<<AI<<","<<name<<")"
            <<endl;    

    if(_m_nrObservations.size() != AI && _m_nrObservations.size() != AI+1)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteObservations::AddObservation("<<AI<<","<<name<<
            ") - error, observations of agents should be specified in order!"<<
            " first all observations of agent 1, then all of agent 2,...etc..."<<
            " _m_nrObservations.size now is: "<< _m_nrObservations.size() <<
            "\n(the vector _m_nrObservations should contain entries for all "<<
            "preceeding agents.)";
        throw(E(ss));
    }
    if(_m_nrObservations.size() == AI )
    {
        //this is the first observation we add for this agent
        _m_nrObservations.push_back(1);

        vector<ObservationDiscrete> thisAgentsObservations;
        ObservationDiscrete ad(0, name, description);
        thisAgentsObservations.push_back(ad);
        _m_observationVecs.push_back(thisAgentsObservations);
    }
    else
    {
        //we add an observation for this agent - increment his nr_observations
        Index newObservationIndex = _m_nrObservations[AI]++;
        ObservationDiscrete ad(newObservationIndex, name, description);
        _m_observationVecs[AI].push_back(ad);
    }
}